

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  int ret;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_ge p;
  secp256k1_gej pj;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar2;
  uint in_stack_fffffffffffffee4;
  uchar *in_stack_fffffffffffffee8;
  secp256k1_scalar *in_stack_fffffffffffffef0;
  secp256k1_ge *in_stack_ffffffffffffff18;
  secp256k1_pubkey *in_stack_ffffffffffffff20;
  secp256k1_gej *in_stack_ffffffffffffff28;
  secp256k1_ge *in_stack_ffffffffffffff30;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_gej *in_stack_ffffffffffffffa8;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffffb0;
  uint local_4;
  
  uVar2 = 0;
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)((ulong)in_stack_fffffffffffffee4 << 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 8));
    if (iVar1 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffee4,uVar2),
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_4 = 0;
    }
    else if (in_RDX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffee4,uVar2),
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_4 = 0;
    }
    else {
      secp256k1_scalar_set_b32
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (int *)CONCAT44(in_stack_fffffffffffffee4,uVar2));
      local_4 = (uint)((in_stack_fffffffffffffee4 != 0 ^ 0xffU) & 1);
      iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xfffffffffffffee8);
      local_4 = local_4 & ((iVar1 != 0 ^ 0xffU) & 1);
      if (local_4 != 0) {
        secp256k1_ecmult_gen
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        secp256k1_ge_set_gej(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        secp256k1_pubkey_save(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffee8);
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_gej pj;
    secp256k1_ge p;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = (!overflow) & (!secp256k1_scalar_is_zero(&sec));
    if (ret) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pj, &sec);
        secp256k1_ge_set_gej(&p, &pj);
        secp256k1_pubkey_save(pubkey, &p);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}